

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O1

void mult_verify::MultVerifyUint64Uint(void)

{
  return;
}

Assistant:

void MultVerifyUint64Uint()
{
	TestVector< std::uint64_t, std::uint32_t, OpType::Mult > tests;
	TestCase<std::uint64_t, std::uint32_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::uint64_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint64_uint32: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::uint64_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case uint64_uint32 throw: ", test.x, test.y, test.fExpected );
		}

		test = tests.GetNext();
	}
}